

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O1

void close_socket_to_openssh_server(libssh2_socket_t sock)

{
  if (sock != -1) {
    shutdown(sock,2);
    close(sock);
    return;
  }
  return;
}

Assistant:

static void close_socket_to_container(libssh2_socket_t sock)
{
    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2 /* SHUT_RDWR */);
#ifdef WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }
}